

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_dupset(SessionHandle *dst,SessionHandle *src)

{
  uint local_20;
  CURLcode local_1c;
  dupstring i;
  CURLcode r;
  SessionHandle *src_local;
  SessionHandle *dst_local;
  
  local_1c = CURLE_OK;
  memcpy(&dst->set,&src->set,0x500);
  memset((dst->set).str,0,0x140);
  local_20 = 0;
  while ((local_20 < 0x28 &&
         (local_1c = setstropt((dst->set).str + local_20,(src->set).str[local_20]),
         local_1c == CURLE_OK))) {
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

CURLcode Curl_dupset(struct SessionHandle *dst, struct SessionHandle *src)
{
  CURLcode r = CURLE_OK;
  enum dupstring i;

  /* Copy src->set into dst->set first, then deal with the strings
     afterwards */
  dst->set = src->set;

  /* clear all string pointers first */
  memset(dst->set.str, 0, STRING_LAST * sizeof(char *));

  /* duplicate all strings */
  for(i=(enum dupstring)0; i< STRING_LAST; i++) {
    r = setstropt(&dst->set.str[i], src->set.str[i]);
    if(r != CURLE_OK)
      break;
  }

  /* If a failure occurred, freeing has to be performed externally. */
  return r;
}